

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O2

void parse_charstrings(T1_Face face,T1_Loader loader)

{
  PS_TableRec *pPVar1;
  byte bVar2;
  FT_Memory pFVar3;
  undefined8 *puVar4;
  FT_Byte *pFVar5;
  ulong __n;
  bool bVar6;
  PS_Table pPVar7;
  FT_UInt FVar8;
  uint uVar9;
  int iVar10;
  FT_Error FVar11;
  FT_Pointer __dest;
  FT_Byte *pFVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  FT_Byte *local_88;
  FT_Byte *base;
  undefined8 *local_78;
  FT_Memory local_70;
  T1_Face local_68;
  PS_Table local_60;
  undefined8 local_58;
  FT_Byte notdef_glyph [5];
  int local_3c;
  int local_38;
  FT_Error local_34;
  FT_Long FVar12;
  
  pFVar3 = (loader->parser).root.memory;
  puVar4 = (undefined8 *)face->psaux;
  pFVar13 = (loader->parser).root.cursor;
  pFVar5 = (loader->parser).root.limit;
  local_68 = face;
  FVar12 = (*(loader->parser).root.funcs.to_int)((PS_Parser)loader);
  uVar9 = (uint)FVar12;
  FVar11 = 3;
  if (-1 < (int)uVar9) {
    lVar15 = (long)pFVar5 - (long)pFVar13 >> 3;
    uVar14 = (uint)lVar15;
    if ((long)(ulong)(uVar9 & 0x7fffffff) <= lVar15) {
      uVar14 = uVar9;
    }
    if (uVar14 == 0) {
      return;
    }
    if ((loader->parser).root.error != 0) {
      return;
    }
    pPVar1 = &loader->charstrings;
    _notdef_glyph = &loader->glyph_names;
    local_60 = &loader->swap_table;
    base = pFVar5;
    local_78 = puVar4;
    if (loader->num_glyphs == 0) {
      FVar11 = (**(code **)*puVar4)(pPVar1,uVar14 + 6,pFVar3);
      if (((FVar11 != 0) ||
          (FVar11 = (**(code **)*puVar4)(_notdef_glyph,uVar14 + 6,pFVar3), FVar11 != 0)) ||
         (FVar11 = (**(code **)*puVar4)(local_60,4,pFVar3), FVar11 != 0)) goto LAB_0022e03b;
      local_34 = 0;
    }
    local_3c = 0;
    bVar6 = false;
    local_38 = 0;
    local_70 = pFVar3;
    while( true ) {
      (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
      pPVar7 = local_60;
      pFVar13 = (loader->parser).root.cursor;
      if (base <= pFVar13) break;
      if (pFVar13 + 3 < base) {
        bVar2 = pFVar13[3];
        if ((((ulong)bVar2 < 0x3f) && ((0x5000832100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) ||
           ((bVar2 - 0x5b < 0x23 && ((0x500000005U >> ((ulong)(bVar2 - 0x5b) & 0x3f) & 1) != 0)))) {
          if (*pFVar13 == 'e') {
            if ((pFVar13[1] == 'n') && (pFVar13[2] == 'd')) break;
          }
          else if ((((*pFVar13 == 'd') && (pFVar13[1] == 'e')) && (pFVar13[2] == 'f')) &&
                  (local_38 != 0)) goto LAB_0022dda2;
        }
      }
      (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
      pFVar5 = (loader->parser).root.cursor;
      if (base <= pFVar5) {
        FVar11 = 3;
        goto LAB_0022e03b;
      }
      if ((loader->parser).root.error != 0) {
        return;
      }
      if (*pFVar13 == '/') {
        if (base <= pFVar13 + 2) {
LAB_0022df3e:
          local_34 = 3;
          FVar11 = local_34;
          goto LAB_0022e03b;
        }
        iVar10 = read_binary_data(&loader->parser,&local_58,&local_88,
                                  ((local_68->root).internal)->incremental_interface !=
                                  (FT_Incremental_InterfaceRec *)0x0);
        if (iVar10 == 0) {
          return;
        }
        if (loader->num_glyphs == 0) {
          pFVar13 = pFVar13 + 1;
          uVar16 = (long)pFVar5 - (long)pFVar13;
          local_34 = (*(loader->glyph_names).funcs.add)
                               (_notdef_glyph,local_38,pFVar13,(int)uVar16 + 1);
          FVar11 = local_34;
          if (local_34 != 0) goto LAB_0022e03b;
          (loader->glyph_names).elements[local_38][uVar16 & 0xffffffff] = '\0';
          if ((*pFVar13 == '.') &&
             (iVar10 = strcmp(".notdef",(char *)(loader->glyph_names).elements[local_38]),
             iVar10 == 0)) {
            bVar6 = true;
            local_3c = local_38;
          }
          FVar8 = (FT_UInt)local_58;
          uVar16 = (ulong)(local_68->type1).private_dict.lenIV;
          if (((long)uVar16 < 0) || ((int)(uVar14 + 5) <= local_38)) {
            local_34 = (*(loader->charstrings).funcs.add)
                                 (pPVar1,local_38,local_88,(FT_UInt)local_58);
          }
          else {
            __n = CONCAT44(local_58._4_4_,(FT_UInt)local_58);
            if (__n <= uVar16) goto LAB_0022df3e;
            __dest = ft_mem_alloc(local_70,__n,&local_34);
            FVar11 = local_34;
            if (local_34 != 0) goto LAB_0022e03b;
            memcpy(__dest,local_88,__n);
            (*(code *)local_78[4])(__dest,__n,0x10ea);
            iVar10 = (local_68->type1).private_dict.lenIV;
            local_34 = (*(loader->charstrings).funcs.add)
                                 (pPVar1,local_38,(void *)((long)__dest + (long)iVar10),
                                  FVar8 - iVar10);
            ft_mem_free(local_70,__dest);
          }
          FVar11 = local_34;
          if (local_34 != 0) goto LAB_0022e03b;
          local_38 = local_38 + (uint)(local_34 == 0);
        }
      }
    }
    FVar11 = 3;
    if (local_38 != 0) {
LAB_0022dda2:
      loader->num_glyphs = local_38;
      if (bVar6) {
        pFVar13 = *(loader->glyph_names).elements;
        iVar10 = strcmp(".notdef",(char *)pFVar13);
        pPVar7 = local_60;
        if (iVar10 == 0) {
          return;
        }
        FVar11 = (*(loader->swap_table).funcs.add)
                           (local_60,0,pFVar13,*(loader->glyph_names).lengths);
        if ((FVar11 == 0) &&
           (local_34 = FVar11,
           FVar11 = (*(loader->swap_table).funcs.add)
                              (pPVar7,1,*(loader->charstrings).elements,
                               *(loader->charstrings).lengths), FVar11 == 0)) {
          lVar15 = (long)local_3c;
          local_34 = FVar11;
          FVar11 = (*(loader->swap_table).funcs.add)
                             (pPVar7,2,(loader->glyph_names).elements[lVar15],
                              (loader->glyph_names).lengths[lVar15]);
          if (((FVar11 == 0) &&
              (((local_34 = FVar11,
                FVar11 = (*(loader->swap_table).funcs.add)
                                   (pPVar7,3,(loader->charstrings).elements[lVar15],
                                    (loader->charstrings).lengths[lVar15]), FVar11 == 0 &&
                (local_34 = FVar11,
                FVar11 = (*(loader->glyph_names).funcs.add)
                                   (_notdef_glyph,local_3c,*(loader->swap_table).elements,
                                    *(loader->swap_table).lengths), FVar11 == 0)) &&
               (local_34 = FVar11,
               FVar11 = (*(loader->charstrings).funcs.add)
                                  (pPVar1,local_3c,(loader->swap_table).elements[1],
                                   (loader->swap_table).lengths[1]), FVar11 == 0)))) &&
             ((local_34 = FVar11,
              FVar11 = (*(loader->glyph_names).funcs.add)
                                 (_notdef_glyph,0,(loader->swap_table).elements[2],
                                  (loader->swap_table).lengths[2]), FVar11 == 0 &&
              (local_34 = FVar11,
              FVar11 = (*(loader->charstrings).funcs.add)
                                 (pPVar1,0,(loader->swap_table).elements[3],
                                  (loader->swap_table).lengths[3]), FVar11 == 0)))) {
            return;
          }
        }
      }
      else {
        local_58._4_4_ = CONCAT31(local_58._5_3_,0xe);
        local_58._0_4_ = 0xde1f78b;
        FVar11 = (*(loader->swap_table).funcs.add)
                           (local_60,0,*(loader->glyph_names).elements,
                            *(loader->glyph_names).lengths);
        if ((((FVar11 == 0) &&
             (local_34 = FVar11,
             FVar11 = (*(loader->swap_table).funcs.add)
                                (pPVar7,1,*(loader->charstrings).elements,
                                 *(loader->charstrings).lengths), pPVar7 = _notdef_glyph,
             FVar11 == 0)) &&
            ((local_34 = FVar11,
             FVar11 = (*(loader->glyph_names).funcs.add)(_notdef_glyph,0,".notdef",8), FVar11 == 0
             && ((local_34 = FVar11,
                 FVar11 = (*(loader->charstrings).funcs.add)(pPVar1,0,&local_58,5), FVar11 == 0 &&
                 (local_34 = FVar11,
                 FVar11 = (*(loader->glyph_names).funcs.add)
                                    (pPVar7,local_38,*(loader->swap_table).elements,
                                     *(loader->swap_table).lengths), FVar11 == 0)))))) &&
           (local_34 = FVar11,
           FVar11 = (*(loader->charstrings).funcs.add)
                              (pPVar1,local_38,(loader->swap_table).elements[1],
                               (loader->swap_table).lengths[1]), FVar11 == 0)) {
          loader->num_glyphs = loader->num_glyphs + 1;
          return;
        }
      }
    }
  }
LAB_0022e03b:
  (loader->parser).root.error = FVar11;
  return;
}

Assistant:

static void
  parse_charstrings( T1_Face    face,
                     T1_Loader  loader )
  {
    T1_Parser      parser       = &loader->parser;
    PS_Table       code_table   = &loader->charstrings;
    PS_Table       name_table   = &loader->glyph_names;
    PS_Table       swap_table   = &loader->swap_table;
    FT_Memory      memory       = parser->root.memory;
    FT_Error       error;

    PSAux_Service  psaux        = (PSAux_Service)face->psaux;

    FT_Byte*       cur          = parser->root.cursor;
    FT_Byte*       limit        = parser->root.limit;
    FT_Int         n, num_glyphs;
    FT_Int         notdef_index = 0;
    FT_Byte        notdef_found = 0;


    num_glyphs = (FT_Int)T1_ToInt( parser );
    if ( num_glyphs < 0 )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    /* we certainly need more than 8 bytes per glyph */
    if ( num_glyphs > ( limit - cur ) >> 3 )
    {
      FT_TRACE0(( "parse_charstrings: adjusting number of glyphs"
                  " (from %d to %d)\n",
                  num_glyphs, ( limit - cur ) >> 3 ));
      num_glyphs = ( limit - cur ) >> 3;
    }

    /* some fonts like Optima-Oblique not only define the /CharStrings */
    /* array but access it also                                        */
    if ( num_glyphs == 0 || parser->root.error )
      return;

    /* initialize tables, leaving space for addition of .notdef, */
    /* if necessary, and a few other glyphs to handle buggy      */
    /* fonts which have more glyphs than specified.              */

    /* for some non-standard fonts like `Optima' which provides  */
    /* different outlines depending on the resolution it is      */
    /* possible to get here twice                                */
    if ( !loader->num_glyphs )
    {
      error = psaux->ps_table_funcs->init(
                code_table, num_glyphs + 1 + TABLE_EXTEND, memory );
      if ( error )
        goto Fail;

      error = psaux->ps_table_funcs->init(
                name_table, num_glyphs + 1 + TABLE_EXTEND, memory );
      if ( error )
        goto Fail;

      /* Initialize table for swapping index notdef_index and */
      /* index 0 names and codes (if necessary).              */

      error = psaux->ps_table_funcs->init( swap_table, 4, memory );
      if ( error )
        goto Fail;
    }

    n = 0;

    for (;;)
    {
      FT_ULong  size;
      FT_Byte*  base;


      /* the format is simple:        */
      /*   `/glyphname' + binary data */

      T1_Skip_Spaces( parser );

      cur = parser->root.cursor;
      if ( cur >= limit )
        break;

      /* we stop when we find a `def' or `end' keyword */
      if ( cur + 3 < limit && IS_PS_DELIM( cur[3] ) )
      {
        if ( cur[0] == 'd' &&
             cur[1] == 'e' &&
             cur[2] == 'f' )
        {
          /* There are fonts which have this: */
          /*                                  */
          /*   /CharStrings 118 dict def      */
          /*   Private begin                  */
          /*   CharStrings begin              */
          /*   ...                            */
          /*                                  */
          /* To catch this we ignore `def' if */
          /* no charstring has actually been  */
          /* seen.                            */
          if ( n )
            break;
        }

        if ( cur[0] == 'e' &&
             cur[1] == 'n' &&
             cur[2] == 'd' )
          break;
      }

      T1_Skip_PS_Token( parser );
      if ( parser->root.cursor >= limit )
      {
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }
      if ( parser->root.error )
        return;

      if ( *cur == '/' )
      {
        FT_UInt  len;


        if ( cur + 2 >= limit )
        {
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

        cur++;                              /* skip `/' */
        len = (FT_UInt)( parser->root.cursor - cur );

        if ( !read_binary_data( parser, &size, &base, IS_INCREMENTAL ) )
          return;

        /* for some non-standard fonts like `Optima' which provides */
        /* different outlines depending on the resolution it is     */
        /* possible to get here twice                               */
        if ( loader->num_glyphs )
          continue;

        error = T1_Add_Table( name_table, n, cur, len + 1 );
        if ( error )
          goto Fail;

        /* add a trailing zero to the name table */
        name_table->elements[n][len] = '\0';

        /* record index of /.notdef */
        if ( *cur == '.'                                              &&
             ft_strcmp( ".notdef",
                        (const char*)(name_table->elements[n]) ) == 0 )
        {
          notdef_index = n;
          notdef_found = 1;
        }

        if ( face->type1.private_dict.lenIV >= 0 &&
             n < num_glyphs + TABLE_EXTEND       )
        {
          FT_Byte*  temp = NULL;


          if ( size <= (FT_ULong)face->type1.private_dict.lenIV )
          {
            error = FT_THROW( Invalid_File_Format );
            goto Fail;
          }

          /* t1_decrypt() shouldn't write to base -- make temporary copy */
          if ( FT_ALLOC( temp, size ) )
            goto Fail;
          FT_MEM_COPY( temp, base, size );
          psaux->t1_decrypt( temp, size, 4330 );
          size -= (FT_ULong)face->type1.private_dict.lenIV;
          error = T1_Add_Table( code_table, n,
                                temp + face->type1.private_dict.lenIV, size );
          FT_FREE( temp );
        }
        else
          error = T1_Add_Table( code_table, n, base, size );
        if ( error )
          goto Fail;

        n++;
      }
    }

    if ( !n )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    loader->num_glyphs = n;

    /* if /.notdef is found but does not occupy index 0, do our magic. */
    if ( notdef_found                                                 &&
         ft_strcmp( ".notdef", (const char*)name_table->elements[0] ) )
    {
      /* Swap glyph in index 0 with /.notdef glyph.  First, add index 0  */
      /* name and code entries to swap_table.  Then place notdef_index   */
      /* name and code entries into swap_table.  Then swap name and code */
      /* entries at indices notdef_index and 0 using values stored in    */
      /* swap_table.                                                     */

      /* Index 0 name */
      error = T1_Add_Table( swap_table, 0,
                            name_table->elements[0],
                            name_table->lengths [0] );
      if ( error )
        goto Fail;

      /* Index 0 code */
      error = T1_Add_Table( swap_table, 1,
                            code_table->elements[0],
                            code_table->lengths [0] );
      if ( error )
        goto Fail;

      /* Index notdef_index name */
      error = T1_Add_Table( swap_table, 2,
                            name_table->elements[notdef_index],
                            name_table->lengths [notdef_index] );
      if ( error )
        goto Fail;

      /* Index notdef_index code */
      error = T1_Add_Table( swap_table, 3,
                            code_table->elements[notdef_index],
                            code_table->lengths [notdef_index] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, notdef_index,
                            swap_table->elements[0],
                            swap_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, notdef_index,
                            swap_table->elements[1],
                            swap_table->lengths [1] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, 0,
                            swap_table->elements[2],
                            swap_table->lengths [2] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, 0,
                            swap_table->elements[3],
                            swap_table->lengths [3] );
      if ( error )
        goto Fail;

    }
    else if ( !notdef_found )
    {
      /* notdef_index is already 0, or /.notdef is undefined in   */
      /* charstrings dictionary.  Worry about /.notdef undefined. */
      /* We take index 0 and add it to the end of the table(s)    */
      /* and add our own /.notdef glyph to index 0.               */

      /* 0 333 hsbw endchar */
      FT_Byte  notdef_glyph[] = { 0x8B, 0xF7, 0xE1, 0x0D, 0x0E };
      char*    notdef_name    = (char *)".notdef";


      error = T1_Add_Table( swap_table, 0,
                            name_table->elements[0],
                            name_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( swap_table, 1,
                            code_table->elements[0],
                            code_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, 0, notdef_name, 8 );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, 0, notdef_glyph, 5 );

      if ( error )
        goto Fail;

      error = T1_Add_Table( name_table, n,
                            swap_table->elements[0],
                            swap_table->lengths [0] );
      if ( error )
        goto Fail;

      error = T1_Add_Table( code_table, n,
                            swap_table->elements[1],
                            swap_table->lengths [1] );
      if ( error )
        goto Fail;

      /* we added a glyph. */
      loader->num_glyphs += 1;
    }

    return;

  Fail:
    parser->root.error = error;
  }